

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O1

void __thiscall DPlayerMenu::PlayerNameChanged(DPlayerMenu *this,FListMenuItem *li)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  FString command;
  char pp [16];
  FString local_30;
  char local_28 [24];
  
  pcVar3 = local_28;
  iVar2 = (*li->_vptr_FListMenuItem[9])(li,0,pcVar3,0xf);
  if ((char)iVar2 == '\0') {
    return;
  }
  FString::FString(&local_30,"name \"");
  do {
    cVar1 = *pcVar3;
    if ((cVar1 == '\"') || (cVar1 == '\\')) {
      FString::operator+=(&local_30,'\\');
    }
    else if (cVar1 == '\0') {
      FString::operator+=(&local_30,'\"');
      C_DoCommand(local_30.Chars,0);
      FString::~FString(&local_30);
      return;
    }
    FString::operator+=(&local_30,*pcVar3);
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void DPlayerMenu::PlayerNameChanged(FListMenuItem *li)
{
	char pp[MAXPLAYERNAME+1];
	const char *p;
	if (li->GetString(0, pp, MAXPLAYERNAME))
	{
		FString command("name \"");

		// Escape any backslashes or quotation marks before sending the name to the console.
		for (p = pp; *p != '\0'; ++p)
		{
			if (*p == '"' || *p == '\\')
			{
				command << '\\';
			}
			command << *p;
		}
		command << '"';
		C_DoCommand (command);
	}
}